

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobotDynamics.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
RobotDynamics::getTau
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,RobotDynamics *this,
          double G,vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                   *R,
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          *P,vector<double,_std::allocator<double>_> *theta_d,
          vector<double,_std::allocator<double>_> *theta_dd)

{
  undefined8 *puVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  uint uVar7;
  long lVar8;
  pointer pMVar9;
  pointer pMVar10;
  iterator __position;
  double dVar11;
  vector<double,_std::allocator<double>_> *pvVar12;
  vector<Eigen::Matrix<double,3,3,0,3,3>,std::allocator<Eigen::Matrix<double,3,3,0,3,3>>> *pvVar13;
  pointer pMVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  Matrix<double,_3,_3,_0,_3,_3> *pMVar18;
  iterator __position_00;
  long lVar19;
  byte bVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  Matrix3d identity_mat;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  w_d;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  w;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  F;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  v_d;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  n;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  f;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  N;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  vC_d;
  assign_op<double,_double> local_269;
  SrcXprType local_268;
  double *pdStack_260;
  double local_258;
  vector<double,_std::allocator<double>_> *local_250;
  SrcXprType local_248;
  double *pdStack_240;
  double local_238;
  double local_228;
  double dStack_220;
  double local_218;
  double local_208;
  undefined8 uStack_200;
  vector<double,_std::allocator<double>_> *local_1f8;
  vector<Eigen::Matrix<double,3,3,0,3,3>,std::allocator<Eigen::Matrix<double,3,3,0,3,3>>> *local_1f0
  ;
  Matrix<double,_3,_1,_0,_3,_1> local_1e8;
  double dStack_1d0;
  double *pdStack_1c8;
  double local_1c0;
  double dStack_1b8;
  double dStack_1b0;
  SrcXprType *local_1a8;
  SrcXprType *local_1a0;
  double dStack_198;
  double local_190;
  allocator_type *paStack_188;
  Matrix<double,_3,_3,_0,_3,_3> local_168;
  double *local_118;
  RobotDynamics *local_110;
  vector<double,_std::allocator<double>_> *local_108;
  vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>> *local_100
  ;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_f8;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_e0;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_c8;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_b0;
  ulong local_98;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_90;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_78;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_60;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_48;
  
  bVar20 = 0;
  uVar16 = (ulong)this->JOINT_NUM;
  local_250 = theta_d;
  local_108 = theta_dd;
  if (((long)(R->
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_finish -
       (long)(R->
             super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7 - uVar16 != 0) {
    __assert_fail("JOINT_NUM == R.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/notlixiang[P]Robot-Arm-Dynamics-Library/RobotDynamics.cpp"
                  ,0x1a,
                  "vector<double> RobotDynamics::getTau(double, vector<Eigen::Matrix3d>, vector<Eigen::Vector3d>, vector<double>, vector<double>)"
                 );
  }
  if (((long)(P->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_finish -
       (long)(P->
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 - uVar16 != 0) {
    __assert_fail("JOINT_NUM == P.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/notlixiang[P]Robot-Arm-Dynamics-Library/RobotDynamics.cpp"
                  ,0x1b,
                  "vector<double> RobotDynamics::getTau(double, vector<Eigen::Matrix3d>, vector<Eigen::Vector3d>, vector<double>, vector<double>)"
                 );
  }
  if ((long)(theta_d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(theta_d->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 != uVar16) {
    __assert_fail("JOINT_NUM == theta_d.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/notlixiang[P]Robot-Arm-Dynamics-Library/RobotDynamics.cpp"
                  ,0x1c,
                  "vector<double> RobotDynamics::getTau(double, vector<Eigen::Matrix3d>, vector<Eigen::Vector3d>, vector<double>, vector<double>)"
                 );
  }
  local_208 = G;
  if ((long)(theta_dd->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(theta_dd->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 != uVar16) {
    __assert_fail("JOINT_NUM == theta_dd.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/notlixiang[P]Robot-Arm-Dynamics-Library/RobotDynamics.cpp"
                  ,0x1d,
                  "vector<double> RobotDynamics::getTau(double, vector<Eigen::Matrix3d>, vector<Eigen::Vector3d>, vector<double>, vector<double>)"
                 );
  }
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector(&local_e0,(ulong)(this->JOINT_NUM + 1),(allocator_type *)&local_1e8);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector(&local_f8,(ulong)(this->JOINT_NUM + 1),(allocator_type *)&local_1e8);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector(&local_b0,(ulong)(this->JOINT_NUM + 1),(allocator_type *)&local_1e8);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector(&local_48,(ulong)(this->JOINT_NUM + 1),(allocator_type *)&local_1e8);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector(&local_c8,(ulong)(this->JOINT_NUM + 1),(allocator_type *)&local_1e8);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector(&local_60,(ulong)(this->JOINT_NUM + 1),(allocator_type *)&local_1e8);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector(&local_78,(ulong)(this->JOINT_NUM + 2),(allocator_type *)&local_1e8);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector(&local_90,(ulong)(this->JOINT_NUM + 2),(allocator_type *)&local_1e8);
  uVar7 = this->JOINT_NUM;
  uVar15 = 1;
  if (uVar7 + 1 == 0) {
LAB_001027f0:
    uVar16 = (ulong)uVar15;
    lVar17 = 0;
    do {
      puVar1 = (undefined8 *)
               ((long)((local_78.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar17);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)
       ((long)((local_78.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar17 + 0x10) = 0;
      *(undefined8 *)
       ((long)((local_90.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar17 + 0x10) = 0;
      puVar1 = (undefined8 *)
               ((long)((local_90.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar17);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar17 = lVar17 + 0x18;
      uVar16 = uVar16 - 1;
    } while (uVar16 != 0);
  }
  else {
    lVar17 = 0;
    do {
      puVar1 = (undefined8 *)
               ((long)((local_e0.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar17);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)
       ((long)((local_e0.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar17 + 0x10) = 0;
      *(undefined8 *)
       ((long)((local_f8.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar17 + 0x10) = 0;
      puVar1 = (undefined8 *)
               ((long)((local_f8.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar17);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)
       ((long)((local_b0.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar17 + 0x10) = 0;
      puVar1 = (undefined8 *)
               ((long)((local_b0.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar17);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)
       ((long)((local_48.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar17 + 0x10) = 0;
      puVar1 = (undefined8 *)
               ((long)((local_48.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar17);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)
       ((long)((local_c8.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar17 + 0x10) = 0;
      puVar1 = (undefined8 *)
               ((long)((local_c8.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar17);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)
       ((long)((local_60.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar17 + 0x10) = 0;
      puVar1 = (undefined8 *)
               ((long)((local_60.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar17);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar17 = lVar17 + 0x18;
    } while ((ulong)(uVar7 + 1) * 0x18 != lVar17);
    uVar15 = uVar7 + 2;
    if (uVar15 != 0) goto LAB_001027f0;
  }
  local_1f8 = __return_storage_ptr__;
  local_1f0 = (vector<Eigen::Matrix<double,3,3,0,3,3>,std::allocator<Eigen::Matrix<double,3,3,0,3,3>>>
               *)R;
  local_110 = this;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(ulong)uVar7,(allocator_type *)&local_1e8);
  local_228 = 0.0;
  dStack_220 = 0.0;
  local_218 = 1.0;
  ((local_b0.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] = 0.0;
  ((local_b0.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] = 0.0;
  ((local_b0.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
       local_208;
  if (this->JOINT_NUM != 0) {
    lVar17 = 0;
    lVar19 = 0;
    uVar16 = 0;
    local_100 = (vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                 *)P;
    do {
      pMVar14 = local_e0.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar13 = local_1f0;
      local_268.m_xpr = (XprTypeNested)(*(long *)local_1f0 + lVar19);
      pdStack_260 = (double *)
                    ((long)((local_e0.
                             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                           m_data.array + lVar17);
      local_208 = (local_250->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar16];
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = (double)(local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array + 2);
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,_3,_3,_0,_3,_3> *)&local_1e8,&local_268,
            (assign_op<double,_double> *)&local_248);
      pMVar9 = local_f8.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = pdStack_260[2] * dStack_1b8 +
            pdStack_260[1] * dStack_1d0 +
            *pdStack_260 *
            local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0];
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = pdStack_260[2] * dStack_1b0 +
            pdStack_260[1] * (double)pdStack_1c8 +
            *pdStack_260 *
            local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1];
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = (double)local_1a8 * pdStack_260[2] + local_1c0 * pdStack_260[1] +
            local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] * *pdStack_260;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = local_208;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = (double)&local_228;
      dVar26 = *(double *)
                ((long)local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[1] + 8);
      pdVar2 = (double *)
               ((long)pMVar14[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array + lVar17);
      *pdVar2 = local_208 * local_228 +
                *(double *)
                 local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[1];
      pdVar2[1] = local_208 * dStack_220 + dVar26;
      *(double *)
       ((long)pMVar14[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array + lVar17 + 0x10) =
           local_208 * local_218 +
           *(double *)
            ((long)local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[1] + 0x10);
      lVar8 = *(long *)pvVar13;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [1] = (double)((long)((local_e0.
                             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                           m_data.array + lVar17);
      local_208 = (local_250->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar16];
      uStack_200 = 0;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)(lVar8 + lVar19);
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,_3,_3,_0,_3,_3> *)&local_1e8,(SrcXprType *)&local_168,
            (assign_op<double,_double> *)&local_248);
      pMVar14 = local_f8.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdStack_240 = (double *)
                    ((long)(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                           m_storage.m_data.array + lVar17);
      dVar26 = *(double *)
                ((long)local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[1] + 0x10);
      dVar24 = *(double *)
                local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1];
      dVar6 = *(double *)
               ((long)local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[1] + 8);
      dVar21 = dVar6 * dStack_1d0 +
               dVar24 * local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[0] + dVar26 * dStack_1b8;
      dVar23 = dVar6 * (double)pdStack_1c8 +
               dVar24 * local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array[1] + dVar26 * dStack_1b0;
      dVar26 = local_1c0 * dVar6 + dVar26 * (double)local_1a8 +
               local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2] * dVar24;
      local_268.m_xpr =
           (XprTypeNested)(dVar23 * local_218 * local_208 - dStack_220 * local_208 * dVar26);
      pdStack_260 = (double *)(dVar26 * local_228 * local_208 - local_218 * local_208 * dVar21);
      local_258 = dVar21 * dStack_220 * local_208 - local_228 * local_208 * dVar23;
      local_208 = (local_108->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar16];
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = (double)(local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array + 3);
      local_248.m_xpr = (XprTypeNested)(lVar8 + lVar19);
      local_98 = uVar16;
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,_3,_3,_0,_3,_3> *)&local_1e8,&local_248,&local_269);
      pMVar9 = local_b0.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [4] = pdStack_240[2] * dStack_1b0 +
            pdStack_240[1] * (double)pdStack_1c8 +
            *pdStack_240 *
            local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1];
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [6] = (double)&local_268;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [8] = local_208;
      local_118 = &local_228;
      dVar26 = *(double *)
                ((long)local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[2] + 8);
      pdVar2 = (double *)
               ((long)pMVar14[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array + lVar17);
      *pdVar2 = local_208 * local_228 +
                *(double *)
                 local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                 m_data.array[2] + (double)local_268.m_xpr;
      pdVar2[1] = local_208 * dStack_220 + dVar26 + (double)pdStack_260;
      *(double *)
       ((long)pMVar14[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array + lVar17 + 0x10) =
           local_208 * local_218 +
           *(double *)
            ((long)local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[2] + 0x10) + local_258;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [0] = (double)(*(long *)local_1f0 + lVar19);
      lVar8 = *(long *)local_100;
      dVar26 = *(double *)
                ((long)((local_f8.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar17);
      pdVar2 = (double *)
               ((long)((local_f8.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar17 + 8);
      dVar24 = *pdVar2;
      dVar6 = pdVar2[1];
      pdVar2 = (double *)(lVar8 + 8 + lVar17);
      dVar21 = *pdVar2;
      dVar23 = pdVar2[1];
      local_268.m_xpr = (XprTypeNested)(dVar23 * dVar24 - dVar6 * dVar21);
      pdStack_260 = (double *)(*(double *)(lVar8 + lVar17) * dVar6 - dVar26 * dVar23);
      local_258 = dVar26 * dVar21 - *(double *)(lVar8 + lVar17) * dVar24;
      dVar26 = *(double *)
                ((long)((local_e0.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar17);
      pdVar2 = (double *)
               ((long)((local_e0.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar17 + 8);
      dVar24 = *pdVar2;
      dVar6 = pdVar2[1];
      pdVar2 = (double *)(lVar8 + 8 + lVar17);
      dVar21 = *pdVar2;
      dVar23 = pdVar2[1];
      dVar27 = dVar6 * *(double *)(lVar8 + lVar17) - dVar23 * dVar26;
      dVar28 = dVar26 * dVar21 - *(double *)(lVar8 + lVar17) * dVar24;
      dVar21 = dVar24 * dVar23 - dVar21 * dVar6;
      local_248.m_xpr = (XprTypeNested)(dVar24 * dVar28 + -dVar6 * dVar27);
      pdStack_240 = (double *)(dVar6 * dVar21 + -dVar26 * dVar28);
      local_238 = dVar21 * -dVar24 + dVar26 * dVar27;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [5] = (double)((long)((local_b0.
                             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                           m_data.array + lVar17);
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [3] = (double)&local_248;
      local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
      [2] = local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
            array[6];
      Eigen::internal::
      Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run((Matrix<double,_3,_3,_0,_3,_3> *)&local_1e8,(SrcXprType *)&local_168,&local_269);
      local_1a0 = (SrcXprType *)
                  (*(double *)
                    local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[5] +
                  (double)*(XprTypeNested *)
                           local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[3] +
                  (double)*(XprTypeNested *)
                           local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[2]);
      dStack_198 = *(double *)
                    ((long)local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                           m_storage.m_data.array[5] + 8) +
                   (double)((SrcXprType *)
                           ((long)local_168.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                  m_storage.m_data.array[3] + 8))->m_xpr +
                   (double)((SrcXprType *)
                           ((long)local_168.
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                  m_storage.m_data.array[2] + 8))->m_xpr;
      local_190 = (double)((SrcXprType *)
                          ((long)local_168.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[2] + 0x10))->m_xpr +
                  (double)((SrcXprType *)
                          ((long)local_168.
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                 m_storage.m_data.array[3] + 0x10))->m_xpr +
                  *(double *)
                   ((long)local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                          m_storage.m_data.array[5] + 0x10);
      pdVar2 = (double *)
               ((long)pMVar9[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array + lVar17);
      *pdVar2 = local_190 * dStack_1b8 +
                dStack_198 * dStack_1d0 +
                (double)local_1a0 *
                local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[0];
      pdVar2[1] = local_190 * dStack_1b0 +
                  dStack_198 * (double)pdStack_1c8 +
                  (double)local_1a0 *
                  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                  m_data.array[1];
      *(double *)
       ((long)pMVar9[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array + lVar17 + 0x10) =
           local_190 * (double)local_1a8 + dStack_198 * local_1c0 +
           local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
           array[2] * (double)local_1a0;
      pMVar9 = (local_110->PC).
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar26 = *(double *)
                ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data + lVar17);
      dVar24 = *(double *)
                ((long)local_e0.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array + lVar17);
      pdVar2 = (double *)
               ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar17 + 8);
      dVar21 = *pdVar2;
      dVar23 = pdVar2[1];
      pdVar2 = (double *)
               ((long)local_f8.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar17 + 8);
      dVar27 = *pdVar2;
      dVar28 = pdVar2[1];
      dVar6 = *(double *)
               ((long)local_f8.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar17);
      pdVar2 = (double *)
               ((long)local_e0.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar17 + 8);
      dVar25 = *pdVar2;
      dVar11 = pdVar2[1];
      dVar29 = dVar11 * dVar26 - dVar23 * dVar24;
      dVar30 = dVar24 * dVar21 - dVar26 * dVar25;
      dVar31 = dVar25 * dVar23 - dVar21 * dVar11;
      pdVar2 = (double *)
               ((long)local_b0.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar17);
      dVar22 = pdVar2[1];
      pdVar3 = (double *)
               ((long)local_48.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar17);
      *pdVar3 = *pdVar2 + dVar25 * dVar30 + -dVar11 * dVar29 + (dVar23 * dVar27 - dVar28 * dVar21);
      pdVar3[1] = dVar22 + dVar11 * dVar31 + -dVar24 * dVar30 + (dVar26 * dVar28 - dVar6 * dVar23);
      *(double *)
       ((long)local_48.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
       lVar17 + 0x10) =
           dVar24 * dVar29 + -dVar25 * dVar31 + dVar6 * dVar21 + -dVar27 * dVar26 +
           *(double *)
            ((long)local_b0.
                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[1].
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array + lVar17 + 0x10);
      dVar26 = (local_110->m).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[local_98];
      uVar16 = local_98 + 1;
      pdVar2 = (double *)
               ((long)local_48.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar17);
      dVar24 = pdVar2[1];
      pdVar3 = (double *)
               ((long)local_c8.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar17);
      *pdVar3 = *pdVar2 * dVar26;
      pdVar3[1] = dVar24 * dVar26;
      *(double *)
       ((long)local_c8.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
       lVar17 + 0x10) =
           dVar26 * *(double *)
                     ((long)local_48.
                            super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[1].
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                            m_data.array + lVar17 + 0x10);
      pMVar10 = (local_110->I).
                super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_std::allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      dVar23 = *(double *)
                ((long)local_e0.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array + lVar17);
      pdVar2 = (double *)
               ((long)local_e0.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar17 + 8);
      dVar27 = *pdVar2;
      dVar28 = pdVar2[1];
      pdVar2 = (double *)
               ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data + lVar19);
      pdVar3 = (double *)
               ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data + lVar19 + 0x18);
      pdVar4 = (double *)
               ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data + lVar19 + 0x30);
      dVar29 = dVar28 * *pdVar4 + dVar27 * *pdVar3 + *pdVar2 * dVar23;
      dVar30 = dVar28 * pdVar4[1] + dVar27 * pdVar3[1] + pdVar2[1] * dVar23;
      dVar22 = *(double *)
                ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + lVar19 + 0x40) * dVar28 +
               *(double *)
                ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + lVar19 + 0x28) * dVar27 +
               *(double *)
                ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + lVar19 + 0x10) * dVar23;
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = (double)(local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                     m_storage.m_data.array + 2);
      dVar26 = *(double *)
                ((long)local_f8.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array + lVar17);
      pdVar2 = (double *)
               ((long)local_f8.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar17 + 8);
      dVar24 = *pdVar2;
      dVar6 = pdVar2[1];
      pdVar2 = (double *)
               ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data + lVar19);
      pdVar3 = (double *)
               ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data + lVar19 + 0x18);
      pdVar4 = (double *)
               ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data + lVar19 + 0x30);
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = dVar6 * *pdVar4 + dVar24 * *pdVar3 + *pdVar2 * dVar26;
      dStack_1d0 = dVar6 * pdVar4[1] + dVar24 * pdVar3[1] + pdVar2[1] * dVar26;
      pdVar2 = (double *)
               ((long)local_f8.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar17);
      dVar25 = *pdVar2;
      dVar11 = pdVar2[1];
      dVar26 = *(double *)
                ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + lVar19 + 0x10);
      dVar24 = *(double *)
                ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                        m_storage.m_data + lVar19 + 0x28);
      dVar6 = *(double *)
               ((long)&(pMVar10->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                       m_storage.m_data + lVar19 + 0x40);
      dVar21 = *(double *)
                ((long)local_f8.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array + lVar17 + 0x10);
      pdVar2 = (double *)
               ((long)local_60.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar17);
      *pdVar2 = local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array[2] + (dVar22 * dVar27 - dVar30 * dVar28);
      pdVar2[1] = dStack_1d0 + (dVar29 * dVar28 - dVar22 * dVar23);
      *(double *)
       ((long)local_60.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
       lVar17 + 0x10) =
           dVar24 * dVar11 + dVar6 * dVar21 + dVar26 * dVar25 + (dVar30 * dVar23 - dVar29 * dVar27);
      lVar19 = lVar19 + 0x48;
      lVar17 = lVar17 + 0x18;
      this = local_110;
      P = (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           *)local_100;
      paStack_188 = (allocator_type *)&local_1e8;
    } while (uVar16 < local_110->JOINT_NUM);
  }
  pvVar13 = local_1f0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       1.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_168.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       1.0;
  __position_00._M_current = *(Matrix<double,_3,_3,_0,_3,_3> **)(local_1f0 + 8);
  if (__position_00._M_current == *(Matrix<double,_3,_3,_0,_3,_3> **)(local_1f0 + 0x10)) {
    std::vector<Eigen::Matrix<double,3,3,0,3,3>,std::allocator<Eigen::Matrix<double,3,3,0,3,3>>>::
    _M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>(local_1f0,__position_00,&local_168);
  }
  else {
    pMVar18 = &local_168;
    for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
      ((__position_00._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
      m_storage.m_data.array[0] =
           (pMVar18->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.
           array[0];
      pMVar18 = (Matrix<double,_3,_3,_0,_3,_3> *)((long)pMVar18 + ((ulong)bVar20 * -2 + 1) * 8);
      __position_00._M_current =
           (Matrix<double,_3,_3,_0,_3,_3> *)
           ((long)__position_00._M_current + ((ulong)bVar20 * -2 + 1) * 8);
    }
    *(long *)(local_1f0 + 8) = *(long *)(local_1f0 + 8) + 0x48;
  }
  pvVar12 = local_1f8;
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  __position._M_current = *(Matrix<double,_3,_1,_0,_3,_1> **)((long)P + 8);
  if (__position._M_current == *(Matrix<double,_3,_1,_0,_3,_1> **)((long)P + 0x10)) {
    std::vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>::
    _M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,std::allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)P,__position,&local_1e8);
  }
  else {
    ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
    m_storage.m_data.array[0] = 0.0;
    ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
    m_storage.m_data.array[1] = 0.0;
    ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
    m_storage.m_data.array[2] = 0.0;
    *(long *)((long)P + 8) = *(long *)((long)P + 8) + 0x18;
  }
  lVar17 = (long)(int)this->JOINT_NUM;
  if (lVar17 < 1) {
    if (local_90.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_00103624;
  }
  else {
    local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (double)(local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data.array + 2);
    pdStack_1c8 = &local_1c0;
    local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
         = (double)(local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                    .m_data.array + 1);
    uVar16 = lVar17 + 1;
    lVar19 = lVar17 * 9 + 8;
    lVar17 = lVar17 * 0x18;
    local_1a8 = &local_268;
    local_1a0 = &local_248;
    do {
      lVar8 = *(long *)pvVar13;
      dVar23 = *(double *)
                ((long)local_78.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array + lVar17);
      pdVar2 = (double *)
               ((long)local_78.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar17 + 8);
      dVar27 = *pdVar2;
      dVar28 = pdVar2[1];
      pdVar2 = (double *)(lVar8 + -0x40 + lVar19 * 8);
      dVar25 = pdVar2[1];
      pdVar3 = (double *)(lVar8 + -0x28 + lVar19 * 8);
      dVar11 = pdVar3[1];
      pdVar4 = (double *)(lVar8 + -0x10 + lVar19 * 8);
      dVar22 = pdVar4[1];
      local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = dVar28 * *pdVar4 + dVar27 * *pdVar3 + *pdVar2 * dVar23;
      pdVar2 = (double *)
               ((long)local_78.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar17);
      dVar29 = *pdVar2;
      dVar30 = pdVar2[1];
      dVar26 = *(double *)(lVar8 + -0x30 + lVar19 * 8);
      dVar24 = *(double *)(lVar8 + -0x18 + lVar19 * 8);
      dVar6 = *(double *)(lVar8 + lVar19 * 8);
      dVar21 = *(double *)
                ((long)local_78.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array + lVar17 + 0x10);
      pdVar2 = (double *)
               ((long)((local_c8.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar17);
      dVar31 = pdVar2[1];
      pdVar3 = (double *)
               ((long)((local_78.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar17);
      *pdVar3 = *pdVar2 + local_1e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[2];
      pdVar3[1] = dVar31 + dVar28 * dVar22 + dVar27 * dVar11 + dVar25 * dVar23;
      *(double *)
       ((long)((local_78.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar17 + 0x10) =
           dVar24 * dVar30 + dVar6 * dVar21 + dVar26 * dVar29 +
           *(double *)
            ((long)((local_c8.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                   array + lVar17 + 0x10);
      pMVar9 = (this->PC).
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar26 = *(double *)
                ((long)&pMVar9[-1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data + lVar17);
      pdVar2 = (double *)
               ((long)&(pMVar9->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                       m_storage.m_data + lVar17 + -0x10);
      dVar6 = *pdVar2;
      dVar21 = pdVar2[1];
      dVar24 = *(double *)
                ((long)((local_c8.
                         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                       m_data.array + lVar17);
      pdVar2 = (double *)
               ((long)((local_c8.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar17 + 8);
      dVar23 = *pdVar2;
      dVar27 = pdVar2[1];
      lVar8 = *(long *)pvVar13;
      local_268.m_xpr = (XprTypeNested)(dVar27 * dVar6 - dVar21 * dVar23);
      pdStack_260 = (double *)(dVar24 * dVar21 - dVar26 * dVar27);
      local_258 = dVar26 * dVar23 - dVar6 * dVar24;
      dVar24 = *(double *)
                ((long)local_78.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1].
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                       .array + lVar17);
      pdVar2 = (double *)
               ((long)local_78.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar17 + 8);
      dVar6 = *pdVar2;
      dVar21 = pdVar2[1];
      pdVar2 = (double *)(lVar8 + -0x40 + lVar19 * 8);
      pdVar3 = (double *)(lVar8 + -0x28 + lVar19 * 8);
      pdVar4 = (double *)(lVar8 + -0x10 + lVar19 * 8);
      dVar26 = *(double *)(*(long *)P + lVar17);
      pdVar5 = (double *)(*(long *)P + 8 + lVar17);
      dVar23 = *pdVar5;
      dVar27 = pdVar5[1];
      dStack_1d0 = (double)((long)((local_60.
                                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                  m_storage.m_data.array + lVar17);
      dVar28 = dVar21 * *pdVar4 + dVar6 * *pdVar3 + *pdVar2 * dVar24;
      dVar25 = dVar21 * pdVar4[1] + dVar6 * pdVar3[1] + pdVar2[1] * dVar24;
      dVar24 = *(double *)(lVar8 + lVar19 * 8) * dVar21 +
               *(double *)(lVar8 + -0x18 + lVar19 * 8) * dVar6 +
               dVar24 * *(double *)(lVar8 + -0x30 + lVar19 * 8);
      local_248.m_xpr = (XprTypeNested)(dVar24 * dVar23 - dVar25 * dVar27);
      pdStack_240 = (double *)(dVar28 * dVar27 - dVar24 * dVar26);
      local_238 = dVar25 * dVar26 - dVar28 * dVar23;
      pdVar2 = (double *)
               ((long)local_90.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar17 + 8);
      dVar26 = *pdVar2;
      dVar24 = pdVar2[1];
      dVar6 = *(double *)
               ((long)local_90.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar17);
      pdVar2 = (double *)(lVar8 + -0x40 + lVar19 * 8);
      pdVar3 = (double *)(lVar8 + -0x28 + lVar19 * 8);
      pdVar4 = (double *)(lVar8 + -0x10 + lVar19 * 8);
      local_1c0 = dVar24 * *pdVar4 + dVar26 * *pdVar3 + *pdVar2 * dVar6;
      dStack_1b8 = dVar24 * pdVar4[1] + dVar26 * pdVar3[1] + pdVar2[1] * dVar6;
      pdVar2 = (double *)
               ((long)local_90.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1].
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + lVar17);
      dStack_1b0 = *(double *)(lVar8 + -0x18 + lVar19 * 8) * pdVar2[1] +
                   *(double *)(lVar8 + lVar19 * 8) *
                   *(double *)
                    ((long)local_90.
                           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[1].
                           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                           m_data.array + lVar17 + 0x10) +
                   *(double *)(lVar8 + -0x30 + lVar19 * 8) * *pdVar2;
      pdVar2 = (double *)
               ((long)((local_60.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar17);
      dVar26 = pdVar2[1];
      pdVar3 = (double *)
               ((long)((local_90.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar17);
      *pdVar3 = *pdVar2 + local_1c0 + (double)local_268.m_xpr + (double)local_248.m_xpr;
      pdVar3[1] = dVar26 + dStack_1b8 + (double)pdStack_260 + (double)pdStack_240;
      *(double *)
       ((long)((local_90.
                super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array +
       lVar17 + 0x10) =
           dStack_1b0 +
           *(double *)
            ((long)((local_60.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                   array + lVar17 + 0x10) + local_258 + local_238;
      pdVar2 = (double *)
               ((long)((local_90.
                        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
                      .array + lVar17);
      (pvVar12->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_start[uVar16 - 2] =
           (this->damping).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar16 - 2] *
           (local_250->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar16 - 2] +
           *(double *)
            ((long)((local_90.
                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                   array + lVar17 + 0x10) * local_218 + pdVar2[1] * dStack_220 + *pdVar2 * local_228
      ;
      uVar16 = uVar16 - 1;
      lVar19 = lVar19 + -9;
      lVar17 = lVar17 + -0x18;
    } while (1 < uVar16);
  }
  operator_delete(local_90.
                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
LAB_00103624:
  if (local_78.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_60.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c8.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b0.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.
                    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return pvVar12;
}

Assistant:

vector<double> RobotDynamics::
getTau(double G, vector<Eigen::Matrix3d> R, vector<Eigen::Vector3d> P,
       vector<double> theta_d, vector<double> theta_dd)
{
    assert(JOINT_NUM == R.size());
    assert(JOINT_NUM == P.size());
    assert(JOINT_NUM == theta_d.size());
    assert(JOINT_NUM == theta_dd.size());

    vector<Eigen::Vector3d> w(JOINT_NUM + 1);
    vector<Eigen::Vector3d> w_d(JOINT_NUM + 1);
    vector<Eigen::Vector3d> v_d(JOINT_NUM + 1);
    vector<Eigen::Vector3d> vC_d(JOINT_NUM + 1);
    vector<Eigen::Vector3d> F(JOINT_NUM + 1);
    vector<Eigen::Vector3d> N(JOINT_NUM + 1);
    vector<Eigen::Vector3d> f(JOINT_NUM + 2);
    vector<Eigen::Vector3d> n(JOINT_NUM + 2);
    for (int i = 0; i < JOINT_NUM + 1; i++)
    {
        w[i].setZero();
        w_d[i].setZero();
        v_d[i].setZero();
        vC_d[i].setZero();
        F[i].setZero();
        N[i].setZero();
    }
    for (int i = 0; i < JOINT_NUM + 2; i++)
    {
        f[i].setZero();
        n[i].setZero();
    }
    vector<double> tau(JOINT_NUM);
    Eigen::Vector3d Z(0, 0, 1);
    v_d[0] = Eigen::Vector3d(0, 0, G);
    for (int i = 0; i < JOINT_NUM; i++)
    {
        w[i + 1] = R[i].inverse() * w[i] + theta_d[i] * Z;
        w_d[i + 1] = R[i].inverse() * w_d[i] + (R[i].inverse() * w[i]).cross(theta_d[i] * Z) + theta_dd[i] * Z;
        v_d[i + 1] = R[i].inverse() * (w_d[i].cross(P[i]) + w[i].cross(w[i].cross(P[i])) + v_d[i]);
        vC_d[i + 1] = w_d[i + 1].cross(PC[i]) + w[i + 1].cross(w[i + 1].cross(PC[i])) + v_d[i + 1];
        F[i + 1] = m[i] * vC_d[i + 1];
        N[i + 1] = I[i] * w_d[i + 1] + w[i + 1].cross(I[i] * w[i + 1]);
    }
    Eigen::Matrix3d identity_mat;
    identity_mat.setIdentity();
    R.push_back(identity_mat);
    P.push_back(Eigen::Vector3d(0, 0, 0));
    for (int i = JOINT_NUM; i >= 1; i--)
    {
        f[i] = R[i] * f[i + 1] + F[i];
        n[i] = N[i] + R[i] * n[i + 1] + PC[i - 1].cross(F[i]) + P[i].cross(R[i] * f[i + 1]);
        tau[i - 1] = n[i].transpose() * Z + damping[i - 1] * theta_d[i - 1];
    }
    return tau;
}